

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

CBString * actionTypeToUString(CBString *__return_storage_ptr__,UINT8 action)

{
  UINT8 action_local;
  
  switch(action) {
  case '2':
    Bstrlib::CBString::CBString(__return_storage_ptr__);
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)action);
    break;
  case '4':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Create");
    break;
  case '5':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Insert");
    break;
  case '6':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Replace");
    break;
  case '7':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Remove");
    break;
  case '8':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Rebuild");
    break;
  case '9':
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Rebase");
  }
  return __return_storage_ptr__;
}

Assistant:

UString actionTypeToUString(const UINT8 action)
{
    switch (action) {
        case Actions::NoAction:      return UString();
        case Actions::Create:        return UString("Create");
        case Actions::Insert:        return UString("Insert");
        case Actions::Replace:       return UString("Replace");
        case Actions::Remove:        return UString("Remove");
        case Actions::Rebuild:       return UString("Rebuild");
        case Actions::Rebase:        return UString("Rebase");
    }
    
    return usprintf("Unknown %02Xh", action);
}